

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

void lws_get_peer_addresses
               (lws *wsi,lws_sockfd_type fd,char *name,int name_len,char *rip,int rip_len)

{
  addrinfo *paVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  addrinfo *result;
  socklen_t len;
  sockaddr_in sin4;
  undefined4 local_84 [3];
  addrinfo *local_78;
  socklen_t local_6c;
  sockaddr local_68;
  addrinfo local_58;
  
  *rip = '\0';
  *name = '\0';
  local_6c = 0x10;
  iVar3 = getpeername(fd,&local_68,&local_6c);
  if (iVar3 < 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    _lws_log(2,"getpeername: %s\n",pcVar5);
  }
  else {
    *rip = '\0';
    *name = '\0';
    local_58.ai_flags = 0;
    local_58.ai_family = 0;
    local_58.ai_addrlen = 0;
    local_58._20_4_ = 0;
    local_58.ai_addr = (sockaddr *)0x0;
    local_58.ai_canonname = (char *)0x0;
    local_58.ai_next = (addrinfo *)0x0;
    local_58.ai_socktype = 1;
    local_58.ai_protocol = 0;
    iVar3 = getnameinfo(&local_68,0x10,name,name_len,(char *)0x0,0,0);
    if ((iVar3 == 0) && (iVar3 = getaddrinfo(name,(char *)0x0,&local_58,&local_78), iVar3 == 0)) {
      bVar2 = false;
      for (paVar1 = local_78; paVar1 != (addrinfo *)0x0; paVar1 = paVar1->ai_next) {
        if (paVar1->ai_family == 2) {
          local_84[0] = *(undefined4 *)(paVar1->ai_addr->sa_data + 2);
          bVar2 = true;
        }
        if (bVar2) break;
      }
      freeaddrinfo(local_78);
      if (bVar2) {
        lws_plat_inet_ntop(2,local_84,rip,rip_len);
      }
    }
  }
  return;
}

Assistant:

void
lws_get_peer_addresses(struct lws *wsi, lws_sockfd_type fd, char *name,
		       int name_len, char *rip, int rip_len)
{
#ifndef LWS_PLAT_OPTEE
	socklen_t len;
#ifdef LWS_WITH_IPV6
	struct sockaddr_in6 sin6;
#endif
	struct sockaddr_in sin4;
	void *p;

	rip[0] = '\0';
	name[0] = '\0';

#ifdef LWS_WITH_IPV6
	if (LWS_IPV6_ENABLED(wsi->vhost)) {
		len = sizeof(sin6);
		p = &sin6;
	} else
#endif
	{
		len = sizeof(sin4);
		p = &sin4;
	}

	if (getpeername(fd, p, &len) < 0) {
		lwsl_warn("getpeername: %s\n", strerror(LWS_ERRNO));
		goto bail;
	}

	lws_get_addresses(wsi->vhost, p, name, name_len, rip, rip_len);

bail:
#endif
	(void)wsi;
	(void)fd;
	(void)name;
	(void)name_len;
	(void)rip;
	(void)rip_len;
}